

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O0

void maxHeapsort(double *heap_v,HighsInt *heap_i,HighsInt n)

{
  double dVar1;
  HighsInt HVar2;
  int in_EDX;
  HighsInt *in_RSI;
  double *in_RDI;
  HighsInt temp_i;
  HighsInt i;
  double temp_v;
  int local_24;
  
  for (local_24 = in_EDX; 1 < local_24; local_24 = local_24 + -1) {
    dVar1 = in_RDI[local_24];
    in_RDI[local_24] = in_RDI[1];
    in_RDI[1] = dVar1;
    HVar2 = in_RSI[local_24];
    in_RSI[local_24] = in_RSI[1];
    in_RSI[1] = HVar2;
    maxHeapify(in_RDI,in_RSI,1,local_24 + -1);
  }
  return;
}

Assistant:

void maxHeapsort(double* heap_v, HighsInt* heap_i, HighsInt n) {
  double temp_v;
  HighsInt i, temp_i;
  for (i = n; i >= 2; i--) {
    temp_v = heap_v[i];
    heap_v[i] = heap_v[1];
    heap_v[1] = temp_v;
    temp_i = heap_i[i];
    heap_i[i] = heap_i[1];
    heap_i[1] = temp_i;
    maxHeapify(heap_v, heap_i, 1, i - 1);
  }
}